

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# font.cc
# Opt level: O1

bool woff2::WriteFont(Font *font,size_t *offset,uint8_t *dst,size_t dst_size)

{
  uint32_t uVar1;
  size_t sVar2;
  bool bVar3;
  _Rb_tree_node_base *p_Var4;
  short sVar5;
  ushort uVar6;
  ushort uVar7;
  bool bVar8;
  
  bVar8 = false;
  if (((ulong)font->num_tables << 4 | 0xc) <= dst_size) {
    uVar1 = font->flavor;
    sVar2 = *offset;
    *offset = sVar2 + 1;
    dst[sVar2] = (uint8_t)(uVar1 >> 0x18);
    sVar2 = *offset;
    *offset = sVar2 + 1;
    dst[sVar2] = (uint8_t)(uVar1 >> 0x10);
    sVar2 = *offset;
    *offset = sVar2 + 1;
    dst[sVar2] = (uint8_t)(uVar1 >> 8);
    sVar2 = *offset;
    *offset = sVar2 + 1;
    dst[sVar2] = (uint8_t)uVar1;
    sVar2 = *offset;
    *(uint16_t *)(dst + sVar2) = font->num_tables << 8 | font->num_tables >> 8;
    *offset = sVar2 + 2;
    sVar5 = 0xf;
    uVar6 = (ushort)*(int *)&font->num_tables;
    if (uVar6 != 0) {
      for (; uVar6 >> sVar5 == 0; sVar5 = sVar5 + -1) {
      }
    }
    if (uVar6 == 0) {
      sVar5 = 0;
    }
    uVar6 = (ushort)(0x10 << ((byte)sVar5 & 0x1f));
    if (sVar5 == 0) {
      uVar6 = 0;
    }
    uVar7 = (short)(*(int *)&font->num_tables << 4) - uVar6;
    *(ushort *)(dst + sVar2 + 2) = uVar6 << 8 | uVar6 >> 8;
    *offset = sVar2 + 4;
    *(short *)(dst + sVar2 + 4) = sVar5 << 8;
    *offset = sVar2 + 6;
    *(ushort *)(dst + sVar2 + 6) = uVar7 * 0x100 | uVar7 >> 8;
    *offset = sVar2 + 8;
    p_Var4 = (font->tables)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    while ((bVar8 = (_Rb_tree_header *)p_Var4 == &(font->tables)._M_t._M_impl.super__Rb_tree_header,
           !bVar8 && (bVar3 = WriteTable((Table *)&p_Var4[1]._M_parent,offset,dst,dst_size), bVar3))
          ) {
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
    }
  }
  return bVar8;
}

Assistant:

bool WriteFont(const Font& font, size_t* offset, uint8_t* dst,
               size_t dst_size) {
  if (dst_size < 12ULL + 16ULL * font.num_tables) {
    return FONT_COMPRESSION_FAILURE();
  }
  StoreU32(font.flavor, offset, dst);
  Store16(font.num_tables, offset, dst);
  uint16_t max_pow2 = font.num_tables ? Log2Floor(font.num_tables) : 0;
  uint16_t search_range = max_pow2 ? 1 << (max_pow2 + 4) : 0;
  uint16_t range_shift = (font.num_tables << 4) - search_range;
  Store16(search_range, offset, dst);
  Store16(max_pow2, offset, dst);
  Store16(range_shift, offset, dst);

  for (const auto& i : font.tables) {
    if (!WriteTable(i.second, offset, dst, dst_size)) {
      return false;
    }
  }

  return true;
}